

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readBitsFromStream(size_t *bitpointer,uchar *bitstream,size_t nbits)

{
  uint i;
  uint result;
  size_t nbits_local;
  uchar *bitstream_local;
  size_t *bitpointer_local;
  
  result = 0;
  for (i = 0; i != nbits; i = i + 1) {
    result = (((int)(uint)bitstream[*bitpointer >> 3] >> ((byte)*bitpointer & 7) & 1U) <<
             ((byte)i & 0x1f)) + result;
    *bitpointer = *bitpointer + 1;
  }
  return result;
}

Assistant:

static unsigned readBitsFromStream(size_t* bitpointer, const unsigned char* bitstream, size_t nbits)
{
  unsigned result = 0, i;
  for(i = 0; i != nbits; ++i)
  {
    result += ((unsigned)READBIT(*bitpointer, bitstream)) << i;
    ++(*bitpointer);
  }
  return result;
}